

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O0

void el::base::utils::Str::replaceFirstWithEscape
               (string_t *str,string_t *replaceWhat,string_t *replaceWith)

{
  char *pcVar1;
  string *psVar2;
  ulong local_38;
  size_t foundAt;
  string_t *replaceWith_local;
  string_t *replaceWhat_local;
  string_t *str_local;
  
  while( true ) {
    local_38 = ::std::__cxx11::string::find((string *)str,(ulong)replaceWhat);
    if (local_38 == 0xffffffffffffffff) {
      return;
    }
    if ((local_38 == 0) ||
       (pcVar1 = (char *)::std::__cxx11::string::operator[]((ulong)str), *pcVar1 != '%')) break;
    if (local_38 == 0) {
      local_38 = 0;
    }
    else {
      local_38 = local_38 - 1;
    }
    ::std::__cxx11::string::erase((ulong)str,local_38);
  }
  psVar2 = (string *)::std::__cxx11::string::length();
  ::std::__cxx11::string::replace((ulong)str,local_38,psVar2);
  return;
}

Assistant:

void Str::replaceFirstWithEscape(base::type::string_t& str, const base::type::string_t& replaceWhat,
                                 const base::type::string_t& replaceWith) {
  std::size_t foundAt = base::type::string_t::npos;
  while ((foundAt = str.find(replaceWhat, foundAt + 1)) != base::type::string_t::npos) {
    if (foundAt > 0 && str[foundAt - 1] == base::consts::kFormatSpecifierChar) {
      str.erase(foundAt > 0 ? foundAt - 1 : 0, 1);
      ++foundAt;
    } else {
      str.replace(foundAt, replaceWhat.length(), replaceWith);
      return;
    }
  }
}